

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_UTF8Reader.h
# Opt level: O0

bool __thiscall
soul::UTF8Reader::advanceIfStartsWith<char_const*,char_const*,char_const*>
          (UTF8Reader *this,char *text,char *others,char *others_1,char *others_2)

{
  bool bVar1;
  undefined1 local_31;
  char *others_local_2;
  char *others_local_1;
  char *others_local;
  char *text_local;
  UTF8Reader *this_local;
  
  bVar1 = advanceIfStartsWith(this,text);
  local_31 = true;
  if (!bVar1) {
    local_31 = advanceIfStartsWith<char_const*,char_const*>(this,others,others_1,others_2);
  }
  return local_31;
}

Assistant:

bool advanceIfStartsWith (const char* text, Args... others)      { return advanceIfStartsWith (text) || advanceIfStartsWith (others...); }